

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtilStats.h
# Opt level: O2

EstimatorStats *
GetErrorStatistics(EstimatorStats *__return_storage_ptr__,
                  vector<Estimates,_std::allocator<Estimates>_> *algo_estimates,Count true_count)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pEVar4;
  pointer pEVar5;
  pointer pEVar6;
  int iVar7;
  long lVar8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var9;
  pointer pdVar10;
  pointer pEVar11;
  ulong uVar12;
  pointer pEVar13;
  pointer pEVar14;
  int iVar15;
  ulong uVar16;
  double dVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  allocator_type local_79;
  double local_78;
  vector<double,_std::allocator<double>_> algo_error_percentage_list;
  vector<double,_std::allocator<double>_> diff;
  
  uVar16 = (ulong)((long)(algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>).
                        _M_impl.super__Vector_impl_data._M_start) >> 5;
  iVar15 = (int)uVar16;
  std::vector<double,_std::allocator<double>_>::vector
            (&algo_error_percentage_list,(long)iVar15,(allocator_type *)&diff);
  lVar8 = 0;
  uVar12 = 0;
  if (0 < iVar15) {
    uVar12 = uVar16 & 0xffffffff;
  }
  for (; uVar12 * 8 != lVar8; lVar8 = lVar8 + 8) {
    *(double *)
     ((long)algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar8) =
         (ABS(*(double *)
               ((long)&((algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>).
                        _M_impl.super__Vector_impl_data._M_start)->estimate + lVar8 * 4) -
              (double)true_count) * 100.0) / (double)true_count;
  }
  iVar7 = (int)((long)((ulong)(uint)(iVar15 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) / 2);
  std::nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             (algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start + iVar7),
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  dVar1 = algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar7];
  _Var9 = std::
          __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  dVar2 = *_Var9._M_current;
  local_78 = 0.0;
  for (pdVar10 = algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pdVar10 !=
      algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish; pdVar10 = pdVar10 + 1) {
    local_78 = local_78 + *pdVar10;
  }
  std::vector<double,_std::allocator<double>_>::vector(&diff,(long)iVar15,&local_79);
  local_78 = local_78 / (double)iVar15;
  pdVar10 = diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start;
  for (; algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start !=
         algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
      algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    *pdVar10 = *algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start - local_78;
    pdVar10 = pdVar10 + 1;
  }
  dVar17 = 0.0;
  for (; diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    dVar17 = dVar17 + *diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start *
                      *diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
  }
  dVar17 = dVar17 / (double)iVar15;
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  pEVar11 = (algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pEVar4 = (algo_estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar13 = pEVar11;
  pEVar5 = pEVar11;
  if (pEVar11 == pEVar4) {
    uVar18 = *(undefined4 *)&pEVar11->fraction_of_vertices_seen;
    uVar19 = *(undefined4 *)((long)&pEVar11->fraction_of_vertices_seen + 4);
    uVar20 = *(undefined4 *)&pEVar11->fraction_of_edges_seen;
    uVar21 = *(undefined4 *)((long)&pEVar11->fraction_of_edges_seen + 4);
  }
  else {
    while (pEVar14 = pEVar13, pEVar13 = pEVar5 + 1, pEVar13 != pEVar4) {
      pEVar6 = pEVar5 + 1;
      pEVar5 = pEVar13;
      if (pEVar6->fraction_of_vertices_seen < pEVar14->fraction_of_vertices_seen ||
          pEVar6->fraction_of_vertices_seen == pEVar14->fraction_of_vertices_seen) {
        pEVar13 = pEVar14;
      }
    }
    uVar18 = SUB84(pEVar14->fraction_of_vertices_seen,0);
    uVar19 = (undefined4)((ulong)pEVar14->fraction_of_vertices_seen >> 0x20);
    pEVar13 = pEVar11;
    pEVar5 = pEVar11;
    while (pEVar14 = pEVar13, pEVar13 = pEVar5 + 1, pEVar13 != pEVar4) {
      pEVar6 = pEVar5 + 1;
      pEVar5 = pEVar13;
      if (pEVar6->fraction_of_edges_seen < pEVar14->fraction_of_edges_seen ||
          pEVar6->fraction_of_edges_seen == pEVar14->fraction_of_edges_seen) {
        pEVar13 = pEVar14;
      }
    }
    uVar20 = SUB84(pEVar14->fraction_of_edges_seen,0);
    uVar21 = (undefined4)((ulong)pEVar14->fraction_of_edges_seen >> 0x20);
    pEVar13 = pEVar11;
    pEVar5 = pEVar11;
    while (pEVar11 = pEVar13, pEVar13 = pEVar5 + 1, pEVar13 != pEVar4) {
      pEVar14 = pEVar5 + 1;
      pEVar5 = pEVar13;
      if (pEVar14->fraction_of_edges_seen < pEVar11->fraction_of_edges_seen ||
          pEVar14->fraction_of_edges_seen == pEVar11->fraction_of_edges_seen) {
        pEVar13 = pEVar11;
      }
    }
  }
  dVar3 = pEVar11->query_complexity;
  __return_storage_ptr__->no_of_repeats = iVar15;
  __return_storage_ptr__->mean_error_percentage = local_78;
  __return_storage_ptr__->median_error_percentage = dVar1;
  __return_storage_ptr__->stddev_error_percentage = dVar17;
  __return_storage_ptr__->max_error_percentage = dVar2;
  *(undefined4 *)&__return_storage_ptr__->vertices_seen_max_percentage = uVar18;
  *(undefined4 *)((long)&__return_storage_ptr__->vertices_seen_max_percentage + 4) = uVar19;
  *(undefined4 *)&__return_storage_ptr__->edges_seen_max_percentage = uVar20;
  *(undefined4 *)((long)&__return_storage_ptr__->edges_seen_max_percentage + 4) = uVar21;
  __return_storage_ptr__->query_complexity_max_percentage = dVar3;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&diff.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&algo_error_percentage_list.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

EstimatorStats GetErrorStatistics(std::vector<Estimates> algo_estimates, Count true_count) {

    int no_of_repeats = (int) algo_estimates.size();

    // Populate the error percentage for each run
    std::vector<double> algo_error_percentage_list(no_of_repeats);
    // TODO consider using lambda function
    for (int i = 0; i < no_of_repeats; i++)
        algo_error_percentage_list[i] =
                std::abs(algo_estimates[i].estimate - true_count) * 100 / true_count;

    int middle_index = no_of_repeats / 2;
    std::nth_element(algo_error_percentage_list.begin(), algo_error_percentage_list.begin() + middle_index,
                     algo_error_percentage_list.end());
    double median_error_percentage = algo_error_percentage_list[middle_index];

    double max_error_percentage = *std::max_element(algo_error_percentage_list.begin(),
                                                    algo_error_percentage_list.end());

    double sum = std::accumulate(algo_error_percentage_list.begin(), algo_error_percentage_list.end(), 0.0);
    double mean_error_percentage = sum / no_of_repeats;

    std::vector<double> diff(no_of_repeats);
    std::transform(algo_error_percentage_list.begin(), algo_error_percentage_list.end(), diff.begin(),
                   [mean_error_percentage](double x) { return x - mean_error_percentage; });
    double sq_sum = std::inner_product(diff.begin(), diff.end(), diff.begin(), 0.0);
    double stdev_error_percentage = std::sqrt(sq_sum / no_of_repeats);


    // Maximum edges and vertices seen over all the runs
    double vertices_seen_percentage = (*std::max_element(algo_estimates.begin(),
                                                         algo_estimates.end(),
                                                         ComparatorByVerticesSeen)).fraction_of_vertices_seen;
    double edges_seen_percentage = (*std::max_element(algo_estimates.begin(),
                                                      algo_estimates.end(),
                                                      ComparatorByEdgesSeen)).fraction_of_edges_seen;

    double query_complexity_percentage = (*std::max_element(algo_estimates.begin(),
                                                      algo_estimates.end(),
                                                      ComparatorByEdgesSeen)).query_complexity;

    EstimatorStats est_stats = {no_of_repeats, mean_error_percentage, median_error_percentage,
                                stdev_error_percentage, max_error_percentage,
                                vertices_seen_percentage, edges_seen_percentage, query_complexity_percentage};
    return est_stats;
}